

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

int BackwardReferencesHashChainFollowChosenPath
              (uint32_t *argb,int cache_bits,uint16_t *chosen_path,int chosen_path_size,
              VP8LHashChain *hash_chain,VP8LBackwardRefs *refs)

{
  ushort len_00;
  bool bVar1;
  uint uVar2;
  uint32_t distance;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  VP8LHashChain *in_R8;
  PixOrCopy in_R9;
  int idx;
  PixOrCopy v;
  int offset;
  int k;
  int len;
  VP8LColorCache hashers;
  int cc_init;
  int ok;
  int i;
  int ix;
  int use_color_cache;
  undefined4 in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  PixOrCopy in_stack_ffffffffffffff70;
  int local_60;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  
  bVar1 = 0 < in_ESI;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  if ((!bVar1) ||
     (local_44 = VP8LColorCacheInit((VP8LColorCache *)
                                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0)
     , local_44 != 0)) {
    VP8LClearBackwardRefs((VP8LBackwardRefs *)in_R9);
    for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
      len_00 = *(ushort *)(in_RDX + (long)local_38 * 2);
      uVar2 = (uint)len_00;
      if (uVar2 == 1) {
        if (bVar1) {
          in_stack_ffffffffffffff6c =
               VP8LColorCacheContains
                         ((VP8LColorCache *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
        else {
          in_stack_ffffffffffffff6c = 0xffffffff;
        }
        if ((int)in_stack_ffffffffffffff6c < 0) {
          if (bVar1) {
            VP8LColorCacheInsert
                      ((VP8LColorCache *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          }
          PixOrCopyCreateLiteral(*(uint32_t *)(in_RDI + (long)local_3c * 4));
        }
        else {
          PixOrCopyCreateCacheIdx(in_stack_ffffffffffffff6c);
        }
        VP8LBackwardRefsCursorAdd
                  ((VP8LBackwardRefs *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                   ,in_stack_ffffffffffffff70);
        local_3c = local_3c + 1;
      }
      else {
        distance = VP8LHashChainFindOffset(in_R8,local_3c);
        in_stack_ffffffffffffff70 = in_R9;
        PixOrCopyCreateCopy(distance,len_00);
        VP8LBackwardRefsCursorAdd
                  ((VP8LBackwardRefs *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                   ,in_stack_ffffffffffffff70);
        if (bVar1) {
          for (local_60 = 0; local_60 < (int)uVar2; local_60 = local_60 + 1) {
            VP8LColorCacheInsert
                      ((VP8LColorCache *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          }
        }
        local_3c = uVar2 + local_3c;
      }
    }
    local_40 = (uint)((*(int *)((long)in_R9 + 4) != 0 ^ 0xffU) & 1);
  }
  if (local_44 != 0) {
    VP8LColorCacheClear((VP8LColorCache *)0x1a119f);
  }
  return local_40;
}

Assistant:

static int BackwardReferencesHashChainFollowChosenPath(
    const uint32_t* const argb, int cache_bits,
    const uint16_t* const chosen_path, int chosen_path_size,
    const VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs) {
  const int use_color_cache = (cache_bits > 0);
  int ix;
  int i = 0;
  int ok = 0;
  int cc_init = 0;
  VP8LColorCache hashers;

  if (use_color_cache) {
    cc_init = VP8LColorCacheInit(&hashers, cache_bits);
    if (!cc_init) goto Error;
  }

  VP8LClearBackwardRefs(refs);
  for (ix = 0; ix < chosen_path_size; ++ix) {
    const int len = chosen_path[ix];
    if (len != 1) {
      int k;
      const int offset = VP8LHashChainFindOffset(hash_chain, i);
      VP8LBackwardRefsCursorAdd(refs, PixOrCopyCreateCopy(offset, len));
      if (use_color_cache) {
        for (k = 0; k < len; ++k) {
          VP8LColorCacheInsert(&hashers, argb[i + k]);
        }
      }
      i += len;
    } else {
      PixOrCopy v;
      const int idx =
          use_color_cache ? VP8LColorCacheContains(&hashers, argb[i]) : -1;
      if (idx >= 0) {
        // use_color_cache is true and hashers contains argb[i]
        // push pixel as a color cache index
        v = PixOrCopyCreateCacheIdx(idx);
      } else {
        if (use_color_cache) VP8LColorCacheInsert(&hashers, argb[i]);
        v = PixOrCopyCreateLiteral(argb[i]);
      }
      VP8LBackwardRefsCursorAdd(refs, v);
      ++i;
    }
  }
  ok = !refs->error_;
 Error:
  if (cc_init) VP8LColorCacheClear(&hashers);
  return ok;
}